

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_expressions.cpp
# Opt level: O0

NameSyntax * __thiscall
slang::parsing::Parser::parseNamePart
          (Parser *this,bitmask<slang::parsing::detail::NameOptions> options)

{
  Token identifier_00;
  Token identifier_01;
  Token identifier_02;
  Token identifier_03;
  Token keyword;
  Token keyword_00;
  Token keyword_01;
  Token identifier_04;
  span<slang::syntax::ElementSelectSyntax_*,_18446744073709551615UL> elements;
  Token identifier_05;
  span<slang::syntax::ElementSelectSyntax_*,_18446744073709551615UL> elements_00;
  Token identifier_06;
  span<slang::syntax::ElementSelectSyntax_*,_18446744073709551615UL> elements_01;
  Token identifier_07;
  bool bVar1;
  int iVar2;
  KeywordNameSyntax *pKVar3;
  undefined4 extraout_var;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *src_00;
  EVP_PKEY_CTX *src_01;
  __extent_storage<18446744073709551615UL> extraout_RDX;
  undefined8 *in_RDI;
  Token TVar4;
  Token TVar5;
  SmallVector<slang::syntax::ElementSelectSyntax_*,_5UL> buffer_1;
  uint32_t index;
  SmallVector<slang::syntax::ElementSelectSyntax_*,_5UL> buffer;
  ParameterValueAssignmentSyntax *parameterValues;
  Token identifier;
  TokenKind next;
  bool isFirst;
  SyntaxKind kind;
  undefined4 in_stack_fffffffffffffb78;
  SyntaxKind in_stack_fffffffffffffb7c;
  undefined4 in_stack_fffffffffffffb80;
  uint32_t in_stack_fffffffffffffb84;
  undefined6 in_stack_fffffffffffffb88;
  undefined6 uVar6;
  TokenKind in_stack_fffffffffffffb8e;
  undefined2 uVar7;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffb90;
  __extent_storage<18446744073709551615UL> _Var8;
  undefined8 in_stack_fffffffffffffb98;
  undefined7 in_stack_fffffffffffffba0;
  undefined1 in_stack_fffffffffffffba7;
  Parser *in_stack_fffffffffffffba8;
  Parser *in_stack_fffffffffffffbc0;
  bool local_421;
  ParserBase *in_stack_fffffffffffffbe0;
  SourceLocation in_stack_fffffffffffffbe8;
  undefined8 in_stack_fffffffffffffbf0;
  DiagCode code;
  TokenKind in_stack_fffffffffffffc0e;
  ParserBase *in_stack_fffffffffffffc10;
  bool local_3a9;
  bool local_39a;
  bool local_399;
  Parser *in_stack_fffffffffffffc78;
  bitmask<slang::parsing::detail::NameOptions> local_294;
  SmallVectorBase<slang::syntax::ElementSelectSyntax_*> local_290 [2];
  undefined8 local_250;
  undefined8 local_208;
  Info *pIStack_200;
  undefined4 local_1ec;
  undefined8 local_1e8;
  Info *pIStack_1e0;
  ElementSelectSyntax *local_1d0;
  undefined8 local_1c8;
  Info *in_stack_fffffffffffffe40;
  BumpAllocator *in_stack_fffffffffffffe48;
  SourceLocation in_stack_fffffffffffffe50;
  SmallVectorBase<slang::syntax::ElementSelectSyntax_*> local_190 [2];
  bitmask<slang::parsing::detail::NameOptions> local_14c;
  undefined8 local_148;
  Info *local_140;
  ParameterValueAssignmentSyntax *local_138;
  undefined8 local_130;
  Info *local_128;
  bitmask<slang::parsing::detail::NameOptions> local_11c;
  Token local_118;
  Token local_108;
  Token local_f8;
  SourceLocation local_e8;
  Token local_e0;
  Token local_d0;
  SourceLocation local_c0;
  undefined4 local_b8;
  bitmask<slang::parsing::detail::NameOptions> local_b4;
  Token local_b0;
  undefined8 local_a0;
  Info *pIStack_98;
  Token local_90;
  TokenKind local_7a;
  Token local_78;
  bitmask<slang::parsing::detail::NameOptions> local_68;
  bitmask<slang::parsing::detail::NameOptions> local_64;
  Token local_60;
  Token local_50;
  bitmask<slang::parsing::detail::NameOptions> local_3c;
  underlying_type local_38;
  byte local_31;
  Token local_30;
  SyntaxKind local_1c;
  IdentifierSelectNameSyntax *local_8;
  
  code = SUB84((ulong)in_stack_fffffffffffffbf0 >> 0x20,0);
  local_30 = ParserBase::peek((ParserBase *)
                              CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
  local_1c = slang::syntax::SyntaxFacts::getKeywordNameExpression(local_30.kind);
  if (local_1c == Unknown) goto LAB_00bf1c54;
  bitmask<slang::parsing::detail::NameOptions>::bitmask(&local_3c,IsFirst);
  local_38 = (underlying_type)
             bitmask<slang::parsing::detail::NameOptions>::operator&
                       ((bitmask<slang::parsing::detail::NameOptions> *)
                        CONCAT26(in_stack_fffffffffffffb8e,in_stack_fffffffffffffb88),
                        (bitmask<slang::parsing::detail::NameOptions> *)
                        CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
  bVar1 = bitmask<slang::parsing::detail::NameOptions>::operator==
                    ((bitmask<slang::parsing::detail::NameOptions> *)
                     CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                     in_stack_fffffffffffffb7c);
  local_31 = (bVar1 ^ 0xffU) & 1;
  bVar1 = slang::syntax::SyntaxFacts::isSpecialMethodName(local_1c);
  if (bVar1) {
    if ((local_31 & 1) == 0) {
      local_50 = ParserBase::consume((ParserBase *)
                                     CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0));
      keyword.rawLen._2_2_ = in_stack_fffffffffffffb8e;
      keyword._0_6_ = in_stack_fffffffffffffb88;
      keyword.info = (Info *)in_stack_fffffffffffffb90._M_extent_value;
      pKVar3 = slang::syntax::SyntaxFactory::keywordName
                         ((SyntaxFactory *)
                          CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                          in_stack_fffffffffffffb7c,keyword);
      return &pKVar3->super_NameSyntax;
    }
    goto LAB_00bf1c54;
  }
  if (local_1c == ConstructorName) {
    local_60 = ParserBase::consume((ParserBase *)
                                   CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0));
    keyword_00.rawLen._2_2_ = in_stack_fffffffffffffb8e;
    keyword_00._0_6_ = in_stack_fffffffffffffb88;
    keyword_00.info = (Info *)in_stack_fffffffffffffb90._M_extent_value;
    pKVar3 = slang::syntax::SyntaxFactory::keywordName
                       ((SyntaxFactory *)
                        CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                        in_stack_fffffffffffffb7c,keyword_00);
    return &pKVar3->super_NameSyntax;
  }
  local_399 = true;
  if ((local_31 & 1) == 0) {
    if (local_1c == SuperHandle) {
      bitmask<slang::parsing::detail::NameOptions>::bitmask(&local_64,PreviousWasThis);
      bVar1 = bitmask<slang::parsing::detail::NameOptions>::has
                        ((bitmask<slang::parsing::detail::NameOptions> *)
                         CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                         (bitmask<slang::parsing::detail::NameOptions> *)
                         CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
      local_399 = true;
      if (bVar1) goto LAB_00bf1bd4;
    }
    if ((local_1c == SuperHandle) || (local_39a = false, local_1c == ThisHandle)) {
      bitmask<slang::parsing::detail::NameOptions>::bitmask(&local_68,PreviousWasLocal);
      local_39a = bitmask<slang::parsing::detail::NameOptions>::has
                            ((bitmask<slang::parsing::detail::NameOptions> *)
                             CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                             (bitmask<slang::parsing::detail::NameOptions> *)
                             CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
    }
    local_399 = local_39a;
  }
LAB_00bf1bd4:
  if (local_399 != false) {
    local_78 = ParserBase::consume((ParserBase *)
                                   CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0));
    keyword_01.rawLen._2_2_ = in_stack_fffffffffffffb8e;
    keyword_01._0_6_ = in_stack_fffffffffffffb88;
    keyword_01.info = (Info *)in_stack_fffffffffffffb90._M_extent_value;
    pKVar3 = slang::syntax::SyntaxFactory::keywordName
                       ((SyntaxFactory *)
                        CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                        in_stack_fffffffffffffb7c,keyword_01);
    return &pKVar3->super_NameSyntax;
  }
LAB_00bf1c54:
  local_90 = ParserBase::peek((ParserBase *)
                              CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
  local_7a = local_90.kind;
  Token::Token((Token *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
  if (local_7a == Identifier) {
    TVar4 = ParserBase::consume((ParserBase *)
                                CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0));
    local_b0._0_8_ = TVar4._0_8_;
    local_a0._0_2_ = local_b0.kind;
    local_a0._2_1_ = local_b0._2_1_;
    local_a0._3_1_ = local_b0.numFlags.raw;
    local_a0._4_4_ = local_b0.rawLen;
    local_b0.info = TVar4.info;
    pIStack_98 = local_b0.info;
    local_b0 = TVar4;
  }
  else {
    local_3a9 = false;
    if ((local_7a != Dot) && (local_3a9 = false, local_7a != DoubleColon)) {
      bitmask<slang::parsing::detail::NameOptions>::bitmask(&local_b4,ExpectingExpression);
      local_3a9 = bitmask<slang::parsing::detail::NameOptions>::has
                            ((bitmask<slang::parsing::detail::NameOptions> *)
                             CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                             (bitmask<slang::parsing::detail::NameOptions> *)
                             CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
    }
    if (local_3a9 == false) {
      TVar4 = ParserBase::expect(in_stack_fffffffffffffc10,in_stack_fffffffffffffc0e);
      local_108._0_8_ = TVar4._0_8_;
      local_a0._0_2_ = local_108.kind;
      local_a0._2_1_ = local_108._2_1_;
      local_a0._3_1_ = local_108.numFlags.raw;
      local_a0._4_4_ = local_108.rawLen;
      local_108.info = TVar4.info;
      pIStack_98 = local_108.info;
      local_108 = TVar4;
    }
    else {
      bVar1 = ParserBase::haveDiagAtCurrentLoc(&in_stack_fffffffffffffbc0->super_ParserBase);
      if (!bVar1) {
        local_b8 = 0x10001;
        local_d0 = ParserBase::peek((ParserBase *)
                                    CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
        local_c0 = Token::location(&local_d0);
        ParserBase::addDiag(in_stack_fffffffffffffbe0,code,in_stack_fffffffffffffbe8);
      }
      local_f8 = ParserBase::peek((ParserBase *)
                                  CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
      local_e8 = Token::location(&local_f8);
      TVar4 = Token::createMissing
                        (in_stack_fffffffffffffe48,
                         (TokenKind)((ulong)in_stack_fffffffffffffe40 >> 0x30),
                         in_stack_fffffffffffffe50);
      local_e0._0_8_ = TVar4._0_8_;
      local_a0._0_2_ = local_e0.kind;
      local_a0._2_1_ = local_e0._2_1_;
      local_a0._3_1_ = local_e0.numFlags.raw;
      local_a0._4_4_ = local_e0.rawLen;
      local_e0.info = TVar4.info;
      pIStack_98 = local_e0.info;
      local_e0 = TVar4;
    }
  }
  local_118 = ParserBase::peek((ParserBase *)
                               CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
  if (local_118.kind == OpenBracket) {
    bitmask<slang::parsing::detail::NameOptions>::bitmask(&local_14c,ForeachName);
    bVar1 = bitmask<slang::parsing::detail::NameOptions>::has
                      ((bitmask<slang::parsing::detail::NameOptions> *)
                       CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                       (bitmask<slang::parsing::detail::NameOptions> *)
                       CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
    if (bVar1) {
      SmallVector<slang::syntax::ElementSelectSyntax_*,_5UL>::SmallVector
                ((SmallVector<slang::syntax::ElementSelectSyntax_*,_5UL> *)0xbf1ff2);
      do {
        scanTypePart<&slang::syntax::SyntaxFacts::isSemicolon>
                  (in_stack_fffffffffffffba8,
                   (uint32_t *)CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0),
                   (TokenKind)((ulong)in_stack_fffffffffffffb98 >> 0x30),
                   (TokenKind)((ulong)in_stack_fffffffffffffb98 >> 0x20));
        TVar5 = ParserBase::peek((ParserBase *)
                                 CONCAT26(in_stack_fffffffffffffb8e,in_stack_fffffffffffffb88),
                                 in_stack_fffffffffffffb84);
        TVar4.info = in_stack_fffffffffffffe40;
        TVar4.kind = (TokenKind)local_1c8;
        TVar4._2_1_ = local_1c8._2_1_;
        TVar4.numFlags.raw = local_1c8._3_1_;
        TVar4.rawLen = local_1c8._4_4_;
        bVar1 = false;
        if (TVar5.kind != OpenBracket) {
          TVar4 = ParserBase::peek((ParserBase *)
                                   CONCAT26(in_stack_fffffffffffffb8e,in_stack_fffffffffffffb88),
                                   in_stack_fffffffffffffb84);
          local_1c8._0_2_ = TVar4.kind;
          bVar1 = (TokenKind)local_1c8 != Dot;
        }
        in_stack_fffffffffffffe40 = TVar4.info;
        local_1c8 = TVar4._0_8_;
        if (bVar1) break;
        local_1d0 = parseElementSelect(in_stack_fffffffffffffbc0);
        SmallVectorBase<slang::syntax::ElementSelectSyntax_*>::push_back
                  ((SmallVectorBase<slang::syntax::ElementSelectSyntax_*> *)
                   CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                   (ElementSelectSyntax **)
                   CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
        bVar1 = ParserBase::peek((ParserBase *)in_stack_fffffffffffffb90._M_extent_value,
                                 in_stack_fffffffffffffb8e);
        TVar4.info = in_stack_fffffffffffffe40;
        TVar4.kind = (TokenKind)local_1c8;
        TVar4._2_1_ = local_1c8._2_1_;
        TVar4.numFlags.raw = local_1c8._3_1_;
        TVar4.rawLen = local_1c8._4_4_;
      } while (bVar1);
      local_1c8 = TVar4._0_8_;
      bVar1 = SmallVectorBase<slang::syntax::ElementSelectSyntax_*>::empty(local_190);
      if (bVar1) {
        local_1e8 = local_a0;
        pIStack_1e0 = pIStack_98;
        identifier_01.rawLen = in_stack_fffffffffffffb7c;
        identifier_01.kind = (short)in_stack_fffffffffffffb78;
        identifier_01._2_1_ = (char)((uint)in_stack_fffffffffffffb78 >> 0x10);
        identifier_01.numFlags.raw = (char)((uint)in_stack_fffffffffffffb78 >> 0x18);
        identifier_01.info._0_4_ = in_stack_fffffffffffffb80;
        identifier_01.info._4_4_ = in_stack_fffffffffffffb84;
        local_8 = (IdentifierSelectNameSyntax *)
                  slang::syntax::SyntaxFactory::identifierName
                            ((SyntaxFactory *)0xbf21bc,identifier_01);
      }
      else {
        local_208 = local_a0;
        pIStack_200 = pIStack_98;
        iVar2 = SmallVectorBase<slang::syntax::ElementSelectSyntax_*>::copy
                          (local_190,(EVP_PKEY_CTX *)*in_RDI,src);
        local_250 = CONCAT44(extraout_var,iVar2);
        elements._M_ptr._6_2_ = in_stack_fffffffffffffb8e;
        elements._M_ptr._0_6_ = in_stack_fffffffffffffb88;
        elements._M_extent._M_extent_value = in_stack_fffffffffffffb90._M_extent_value;
        slang::syntax::SyntaxList<slang::syntax::ElementSelectSyntax>::SyntaxList
                  ((SyntaxList<slang::syntax::ElementSelectSyntax> *)
                   CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),elements);
        identifier_05.rawLen._2_2_ = in_stack_fffffffffffffb8e;
        identifier_05._0_6_ = in_stack_fffffffffffffb88;
        identifier_05.info = (Info *)in_stack_fffffffffffffb90._M_extent_value;
        local_8 = slang::syntax::SyntaxFactory::identifierSelectName
                            ((SyntaxFactory *)
                             CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                             identifier_05,
                             (SyntaxList<slang::syntax::ElementSelectSyntax> *)
                             CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
      }
      local_1ec = 1;
      SmallVector<slang::syntax::ElementSelectSyntax_*,_5UL>::~SmallVector
                ((SmallVector<slang::syntax::ElementSelectSyntax_*,_5UL> *)0xbf22b6);
    }
    else {
      SmallVector<slang::syntax::ElementSelectSyntax_*,_5UL>::SmallVector
                ((SmallVector<slang::syntax::ElementSelectSyntax_*,_5UL> *)0xbf22c8);
      do {
        bitmask<slang::parsing::detail::NameOptions>::bitmask(&local_294,SequenceExpr);
        bVar1 = bitmask<slang::parsing::detail::NameOptions>::has
                          ((bitmask<slang::parsing::detail::NameOptions> *)
                           CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                           (bitmask<slang::parsing::detail::NameOptions> *)
                           CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
        local_421 = false;
        if (bVar1) {
          local_421 = isSequenceRepetition(in_stack_fffffffffffffba8);
        }
        if (local_421 != false) {
          bVar1 = SmallVectorBase<slang::syntax::ElementSelectSyntax_*>::empty(local_290);
          if (bVar1) {
            identifier_02.rawLen = in_stack_fffffffffffffb7c;
            identifier_02.kind = (short)in_stack_fffffffffffffb78;
            identifier_02._2_1_ = (char)((uint)in_stack_fffffffffffffb78 >> 0x10);
            identifier_02.numFlags.raw = (char)((uint)in_stack_fffffffffffffb78 >> 0x18);
            identifier_02.info._0_4_ = in_stack_fffffffffffffb80;
            identifier_02.info._4_4_ = in_stack_fffffffffffffb84;
            local_8 = (IdentifierSelectNameSyntax *)
                      slang::syntax::SyntaxFactory::identifierName
                                ((SyntaxFactory *)0xbf236f,identifier_02);
          }
          else {
            SmallVectorBase<slang::syntax::ElementSelectSyntax_*>::copy
                      (local_290,(EVP_PKEY_CTX *)*in_RDI,src_00);
            elements_00._M_ptr._6_2_ = in_stack_fffffffffffffb8e;
            elements_00._M_ptr._0_6_ = in_stack_fffffffffffffb88;
            elements_00._M_extent._M_extent_value = in_stack_fffffffffffffb90._M_extent_value;
            slang::syntax::SyntaxList<slang::syntax::ElementSelectSyntax>::SyntaxList
                      ((SyntaxList<slang::syntax::ElementSelectSyntax> *)
                       CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),elements_00);
            identifier_06.rawLen._2_2_ = in_stack_fffffffffffffb8e;
            identifier_06._0_6_ = in_stack_fffffffffffffb88;
            identifier_06.info = (Info *)in_stack_fffffffffffffb90._M_extent_value;
            local_8 = slang::syntax::SyntaxFactory::identifierSelectName
                                ((SyntaxFactory *)
                                 CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                                 identifier_06,
                                 (SyntaxList<slang::syntax::ElementSelectSyntax> *)
                                 CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
          }
          goto LAB_00bf2598;
        }
        in_stack_fffffffffffffba8 = (Parser *)parseElementSelect(in_stack_fffffffffffffbc0);
        SmallVectorBase<slang::syntax::ElementSelectSyntax_*>::push_back
                  ((SmallVectorBase<slang::syntax::ElementSelectSyntax_*> *)
                   CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                   (ElementSelectSyntax **)
                   CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
        bVar1 = ParserBase::peek((ParserBase *)in_stack_fffffffffffffb90._M_extent_value,
                                 in_stack_fffffffffffffb8e);
      } while (bVar1);
      uVar6 = SUB86(in_RDI + 0x1c,0);
      uVar7 = (undefined2)((ulong)(in_RDI + 0x1c) >> 0x30);
      SmallVectorBase<slang::syntax::ElementSelectSyntax_*>::copy
                (local_290,(EVP_PKEY_CTX *)*in_RDI,src_01);
      elements_01._M_ptr._6_2_ = uVar7;
      elements_01._M_ptr._0_6_ = uVar6;
      elements_01._M_extent._M_extent_value = extraout_RDX._M_extent_value;
      _Var8._M_extent_value = extraout_RDX._M_extent_value;
      slang::syntax::SyntaxList<slang::syntax::ElementSelectSyntax>::SyntaxList
                ((SyntaxList<slang::syntax::ElementSelectSyntax> *)
                 CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),elements_01);
      identifier_07.rawLen._2_2_ = uVar7;
      identifier_07._0_6_ = uVar6;
      identifier_07.info = (Info *)_Var8._M_extent_value;
      local_8 = slang::syntax::SyntaxFactory::identifierSelectName
                          ((SyntaxFactory *)
                           CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                           identifier_07,
                           (SyntaxList<slang::syntax::ElementSelectSyntax> *)
                           CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
LAB_00bf2598:
      local_1ec = 1;
      SmallVector<slang::syntax::ElementSelectSyntax_*,_5UL>::~SmallVector
                ((SmallVector<slang::syntax::ElementSelectSyntax_*,_5UL> *)0xbf25a5);
    }
  }
  else if (local_118.kind == Hash) {
    bitmask<slang::parsing::detail::NameOptions>::bitmask(&local_11c,NoClassScope);
    bVar1 = bitmask<slang::parsing::detail::NameOptions>::has
                      ((bitmask<slang::parsing::detail::NameOptions> *)
                       CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                       (bitmask<slang::parsing::detail::NameOptions> *)
                       CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
    if (bVar1) {
      local_130 = local_a0;
      local_128 = pIStack_98;
      identifier_00.rawLen = in_stack_fffffffffffffb7c;
      identifier_00.kind = (short)in_stack_fffffffffffffb78;
      identifier_00._2_1_ = (char)((uint)in_stack_fffffffffffffb78 >> 0x10);
      identifier_00.numFlags.raw = (char)((uint)in_stack_fffffffffffffb78 >> 0x18);
      identifier_00.info._0_4_ = in_stack_fffffffffffffb80;
      identifier_00.info._4_4_ = in_stack_fffffffffffffb84;
      local_8 = (IdentifierSelectNameSyntax *)
                slang::syntax::SyntaxFactory::identifierName
                          ((SyntaxFactory *)0xbf1f38,identifier_00);
    }
    else {
      local_138 = parseParameterValueAssignment(in_stack_fffffffffffffc78);
      local_148 = local_a0;
      local_140 = pIStack_98;
      identifier_04.rawLen._2_2_ = in_stack_fffffffffffffb8e;
      identifier_04._0_6_ = in_stack_fffffffffffffb88;
      identifier_04.info = (Info *)in_stack_fffffffffffffb90._M_extent_value;
      local_8 = (IdentifierSelectNameSyntax *)
                slang::syntax::SyntaxFactory::className
                          ((SyntaxFactory *)
                           CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                           identifier_04,
                           (ParameterValueAssignmentSyntax *)
                           CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
    }
  }
  else {
    identifier_03.rawLen = in_stack_fffffffffffffb7c;
    identifier_03.kind = (short)in_stack_fffffffffffffb78;
    identifier_03._2_1_ = (char)((uint)in_stack_fffffffffffffb78 >> 0x10);
    identifier_03.numFlags.raw = (char)((uint)in_stack_fffffffffffffb78 >> 0x18);
    identifier_03.info._0_4_ = in_stack_fffffffffffffb80;
    identifier_03.info._4_4_ = in_stack_fffffffffffffb84;
    local_8 = (IdentifierSelectNameSyntax *)
              slang::syntax::SyntaxFactory::identifierName((SyntaxFactory *)0xbf25eb,identifier_03);
  }
  return &local_8->super_NameSyntax;
}

Assistant:

NameSyntax& Parser::parseNamePart(bitmask<NameOptions> options) {
    auto kind = getKeywordNameExpression(peek().kind);
    if (kind != SyntaxKind::Unknown) {
        // This is a keyword name such as "super", "xor", or "new".
        bool isFirst = (options & NameOptions::IsFirst) != 0;
        if (isSpecialMethodName(kind)) {
            // The built-in methods ("xor", "unique", etc) and are not allowed
            // to be the first element in the name.
            if (!isFirst)
                return factory.keywordName(kind, consume());
        }
        else if (kind == SyntaxKind::ConstructorName) {
            // "new" names are always allowed.
            return factory.keywordName(kind, consume());
        }
        else {
            // Otherwise this is "$unit", "$root", "local", "this", "super".
            // These are only allowed to be the first element in a path, except
            // for "super" which can follow "this".
            if (isFirst ||
                (kind == SyntaxKind::SuperHandle && options.has(NameOptions::PreviousWasThis)) ||
                ((kind == SyntaxKind::SuperHandle || kind == SyntaxKind::ThisHandle) &&
                 options.has(NameOptions::PreviousWasLocal))) {
                return factory.keywordName(kind, consume());
            }
        }

        // Otherwise fall through to the handling below to get an error emitted.
    }

    TokenKind next = peek().kind;
    Token identifier;
    if (next == TokenKind::Identifier) {
        identifier = consume();
    }
    else if (next != TokenKind::Dot && next != TokenKind::DoubleColon &&
             options.has(NameOptions::ExpectingExpression)) {
        if (!haveDiagAtCurrentLoc())
            addDiag(diag::ExpectedExpression, peek().location());
        identifier = Token::createMissing(alloc, TokenKind::Identifier, peek().location());
    }
    else {
        identifier = expect(TokenKind::Identifier);
    }

    switch (peek().kind) {
        case TokenKind::Hash: {
            if (options.has(NameOptions::NoClassScope))
                return factory.identifierName(identifier);

            auto parameterValues = parseParameterValueAssignment();
            SLANG_ASSERT(parameterValues);
            return factory.className(identifier, *parameterValues);
        }
        case TokenKind::OpenBracket: {
            if (options.has(NameOptions::ForeachName)) {
                // For a foreach loop declaration, the final selector
                // brackets need to be parsed specially because they declare
                // loop variable names. All the selectors prior can be
                // parsed as normal selectors.
                SmallVector<ElementSelectSyntax*> buffer;
                do {
                    uint32_t index = 1;
                    scanTypePart<isSemicolon>(index, TokenKind::OpenBracket,
                                              TokenKind::CloseBracket);
                    if (peek(index).kind != TokenKind::OpenBracket &&
                        peek(index).kind != TokenKind::Dot) {
                        break;
                    }

                    buffer.push_back(&parseElementSelect());
                } while (peek(TokenKind::OpenBracket));

                if (buffer.empty())
                    return factory.identifierName(identifier);

                return factory.identifierSelectName(identifier, buffer.copy(alloc));
            }
            else {
                SmallVector<ElementSelectSyntax*> buffer;
                do {
                    // Inside a sequence expression this could be a repetition directive
                    // instead of a selection.
                    if (options.has(NameOptions::SequenceExpr) && isSequenceRepetition()) {
                        if (buffer.empty())
                            return factory.identifierName(identifier);
                        else
                            return factory.identifierSelectName(identifier, buffer.copy(alloc));
                    }

                    buffer.push_back(&parseElementSelect());
                } while (peek(TokenKind::OpenBracket));

                return factory.identifierSelectName(identifier, buffer.copy(alloc));
            }
        }
        default: {
            return factory.identifierName(identifier);
        }
    }
}